

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O1

void add_file_if_regex_ok(regex *r,list<int,_std::allocator<int>_> *file_list,string *file_name)

{
  size_t *psVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char *__nptr;
  int *piVar3;
  long lVar4;
  _List_node_base *p_Var5;
  undefined1 auVar6 [12];
  string in_file;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  char *local_38;
  
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = '\0';
  __first._M_current = (file_name->_M_dataplus)._M_p;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + file_name->_M_string_length),r,"$1",2,0);
  __nptr = local_58;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    p_Var5 = (_List_node_base *)operator_new(0x18);
    *(int *)&p_Var5[1]._M_next = (int)lVar4;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(file_list->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    goto LAB_0010ab83;
  }
  auVar6 = std::__throw_out_of_range("stoi");
  if (auVar6._8_4_ != 1) {
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    _Unwind_Resume(auVar6._0_8_);
  }
  __cxa_begin_catch(auVar6._0_8_);
  __cxa_end_catch();
LAB_0010ab83:
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void add_file_if_regex_ok(const regex &r, list<int> &file_list, const string &file_name) {
    string in_file = regex_replace(file_name, r, "$1");

    // NOTE: If the regex did not find anything, the original string is passed on to in_file
    //       -> With stoi, this should be handled with the exception catching
    try {
        int in_no = stoi(in_file);
        file_list.push_back(in_no);
    }
    catch (exception &e) {
        // Do nothing
    }
}